

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::AsyncInputStream> * __thiscall
kj::Own<kj::AsyncInputStream>::operator=
          (Own<kj::AsyncInputStream> *this,Own<kj::AsyncInputStream> *other)

{
  AsyncInputStream *object;
  Dispose_<kj::AsyncInputStream,_true> *this_00;
  AsyncInputStream *pAVar1;
  Disposer *in_RDX;
  
  object = (AsyncInputStream *)this->disposer;
  this_00 = (Dispose_<kj::AsyncInputStream,_true> *)this->ptr;
  pAVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pAVar1;
  other->ptr = (AsyncInputStream *)0x0;
  if (this_00 != (Dispose_<kj::AsyncInputStream,_true> *)0x0) {
    Disposer::Dispose_<kj::AsyncInputStream,_true>::dispose(this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }